

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.cpp
# Opt level: O0

size_t Diligent::ShaderResourceCacheGL::GetRequiredMemorySize(TResourceCount *ResCount)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  const_reference pvVar4;
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  unsigned_long MemSize;
  TResourceCount *ResCount_local;
  
  pvVar4 = std::array<unsigned_short,_4UL>::operator[](ResCount,0);
  uVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_short,_4UL>::operator[](ResCount,1);
  uVar2 = *pvVar4;
  pvVar4 = std::array<unsigned_short,_4UL>::operator[](ResCount,2);
  uVar3 = *pvVar4;
  pvVar4 = std::array<unsigned_short,_4UL>::operator[](ResCount,3);
  msg.field_2._8_8_ =
       (ulong)uVar1 * 0x18 + (ulong)uVar2 * 0x18 + (ulong)uVar3 * 0x18 + (ulong)*pvVar4 * 0x10;
  if (0xfffe < (ulong)msg.field_2._8_8_) {
    FormatString<char[45]>
              ((string *)local_38,(char (*) [45])"Memory size exceed the maximum allowed size.");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetRequiredMemorySize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x31);
    std::__cxx11::string::~string((string *)local_38);
  }
  return msg.field_2._8_8_;
}

Assistant:

size_t ShaderResourceCacheGL::GetRequiredMemorySize(const TResourceCount& ResCount)
{
    static_assert(std::is_same<TResourceCount, PipelineResourceSignatureGLImpl::TBindings>::value,
                  "ShaderResourceCacheGL::TResourceCount must be the same type as PipelineResourceSignatureGLImpl::TBindings");
    // clang-format off
    auto MemSize =
                sizeof(CachedUB)           * ResCount[BINDING_RANGE_UNIFORM_BUFFER] +
                sizeof(CachedResourceView) * ResCount[BINDING_RANGE_TEXTURE]        +
                sizeof(CachedResourceView) * ResCount[BINDING_RANGE_IMAGE]          +
                sizeof(CachedSSBO)         * ResCount[BINDING_RANGE_STORAGE_BUFFER];
    // clang-format on
    VERIFY(MemSize < InvalidResourceOffset, "Memory size exceed the maximum allowed size.");
    return MemSize;
}